

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmFuncts.cpp
# Opt level: O2

int AsmFuncts::getType(string *op)

{
  __type_conflict _Var1;
  int in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ulong uVar3;
  long lVar4;
  string local_50;
  
  Conversion::decToBin_abi_cxx11_(&local_50,(Conversion *)0x0,6,in_ECX);
  _Var1 = std::operator==(op,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (_Var1) {
    return 1;
  }
  uVar3 = 0xffffffffffffffff;
  lVar4 = 0;
  while (uVar3 = uVar3 + 1,
        uVar3 < (ulong)((long)Codes::typeROp_abi_cxx11_.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)Codes::typeROp_abi_cxx11_.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 6)) {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&((Codes::typeROp_abi_cxx11_.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p + lVar4);
    lVar4 = lVar4 + 0x40;
    _Var1 = std::operator==(op,pbVar2);
    if (_Var1) {
      return 1;
    }
  }
  uVar3 = 0xffffffffffffffff;
  lVar4 = 0;
  do {
    uVar3 = uVar3 + 1;
    if ((ulong)((long)Codes::typeIOp_abi_cxx11_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)Codes::typeIOp_abi_cxx11_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) <= uVar3) {
      uVar3 = 0xffffffffffffffff;
      lVar4 = 0;
      while( true ) {
        uVar3 = uVar3 + 1;
        if ((ulong)((long)Codes::typeJOp_abi_cxx11_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)Codes::typeJOp_abi_cxx11_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 6) <= uVar3) {
          return -1;
        }
        _Var1 = std::operator==(op,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&((Codes::typeJOp_abi_cxx11_.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->first).
                                              _M_dataplus._M_p + lVar4));
        if (_Var1) break;
        pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((Codes::typeJOp_abi_cxx11_.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->second)._M_dataplus._M_p +
                 lVar4);
        lVar4 = lVar4 + 0x40;
        _Var1 = std::operator==(op,pbVar2);
        if (_Var1) {
          return 3;
        }
      }
      return 3;
    }
    _Var1 = std::operator==(op,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((Codes::typeIOp_abi_cxx11_.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->first).
                                       _M_dataplus._M_p + lVar4));
    if (_Var1) {
      return 2;
    }
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&((Codes::typeIOp_abi_cxx11_.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->second)._M_dataplus._M_p + lVar4)
    ;
    lVar4 = lVar4 + 0x40;
    _Var1 = std::operator==(op,pbVar2);
  } while (!_Var1);
  return 2;
}

Assistant:

int AsmFuncts::getType(string op){
    if(op == Conversion::decToBin(0,6))
        return TYPE_R;
    for (int i = 0; i < Codes::typeROp.size(); i++)
        if((op == Codes::typeROp[i].first))
            return TYPE_R;

    for (int i = 0; i < Codes::typeIOp.size(); i++)
        if((op == Codes::typeIOp[i].first) || (op == Codes::typeIOp[i].second))
            return TYPE_I;

    for (int i = 0; i < Codes::typeJOp.size(); i++)
        if((op == Codes::typeJOp[i].first) || (op == Codes::typeJOp[i].second))
            return TYPE_J;
    return -1;
}